

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O2

void __thiscall cppforth::Forth::allot(Forth *this)

{
  uint uVar1;
  
  requireDStackDepth(this,1,"ALLOT");
  checkValidHere(this,"ALLOT");
  requireDataSpaceAvailable(this,(ulong)this->CellSize,"ALLOT");
  uVar1 = ForthStack<unsigned_int>::getTop(&this->dStack);
  this->dataPointer = this->dataPointer + uVar1;
  ForthStack<unsigned_int>::pop(&this->dStack);
  return;
}

Assistant:

void allot() {
			REQUIRE_DSTACK_DEPTH(1, "ALLOT");
			REQUIRE_VALID_HERE("ALLOT");
			REQUIRE_DATASPACE_AVAILABLE(CellSize, "ALLOT");
			incDataPointer( static_cast<SCell>( dStack.getTop() ) ); pop();
		}